

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::root_directory(path *__return_storage_ptr__,path *this)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  string_type local_30;
  
  if ((((2 < (this->_path)._M_string_length) &&
       (pcVar1 = (this->_path)._M_dataplus._M_p, *pcVar1 == '/')) && (pcVar1[1] == '/')) &&
     (pcVar1[2] != 0x2f)) {
    iVar2 = isprint((int)pcVar1[2]);
    if (iVar2 != 0) {
      uVar3 = std::__cxx11::string::find((char)this,0x2f);
      if (uVar3 == 0xffffffffffffffff) {
        uVar3 = (this->_path)._M_string_length;
      }
      goto LAB_0011eb92;
    }
  }
  uVar3 = 0;
LAB_0011eb92:
  if ((uVar3 < (this->_path)._M_string_length) && ((this->_path)._M_dataplus._M_p[uVar3] == '/')) {
    if (root_directory()::_root_dir == '\0') {
      iVar2 = __cxa_guard_acquire(&root_directory()::_root_dir);
      if (iVar2 != 0) {
        local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_30,'\x01');
        path(&root_directory::_root_dir,&local_30,native_format);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_30._M_dataplus._M_p != &local_30.field_2) {
          operator_delete(local_30._M_dataplus._M_p);
        }
        __cxa_atexit(~path,&root_directory::_root_dir,&__dso_handle);
        __cxa_guard_release(&root_directory()::_root_dir);
      }
    }
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,root_directory::_root_dir._path._M_dataplus._M_p,
               root_directory::_root_dir._path._M_dataplus._M_p +
               root_directory::_root_dir._path._M_string_length);
  }
  else {
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::root_directory() const
{
    if (has_root_directory()) {
        static const path _root_dir(std::string(1, preferred_separator), native_format);
        return _root_dir;
    }
    return path();
}